

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O1

cmValue __thiscall cmSourceFile::GetPropertyForUser(cmSourceFile *this,string *prop)

{
  size_t sVar1;
  bool bVar2;
  int iVar3;
  PolicyStatus PVar4;
  PolicyStatus PVar5;
  cmValue cVar6;
  string *psVar7;
  
  sVar1 = prop->_M_string_length;
  if ((sVar1 == propLOCATION_abi_cxx11_._M_string_length) &&
     ((sVar1 == 0 ||
      (iVar3 = bcmp((prop->_M_dataplus)._M_p,propLOCATION_abi_cxx11_._M_dataplus._M_p,sVar1),
      iVar3 == 0)))) {
    ResolveFullPath(this,(string *)0x0,(string *)0x0);
  }
  sVar1 = prop->_M_string_length;
  if ((sVar1 == propLANGUAGE_abi_cxx11_._M_string_length) &&
     ((sVar1 == 0 ||
      (iVar3 = bcmp((prop->_M_dataplus)._M_p,propLANGUAGE_abi_cxx11_._M_dataplus._M_p,sVar1),
      iVar3 == 0)))) {
    cVar6.Value = GetOrDetermineLanguage_abi_cxx11_(this);
    return (cmValue)cVar6.Value;
  }
  if ((sVar1 == propGENERATED_abi_cxx11_._M_string_length) &&
     ((sVar1 == 0 ||
      (iVar3 = bcmp((prop->_M_dataplus)._M_p,propGENERATED_abi_cxx11_._M_dataplus._M_p,sVar1),
      iVar3 == 0)))) {
    PVar4 = cmMakefile::GetPolicyStatus((this->Location).Makefile,CMP0163,false);
    PVar5 = cmMakefile::GetPolicyStatus((this->Location).Makefile,CMP0118,false);
    if (this->IsGenerated == false) {
      if ((PVar5 | PVar4) < NEW) {
        bVar2 = GetPropertyAsBool(this,&propGENERATED_abi_cxx11_);
        psVar7 = &propFALSE_abi_cxx11_;
        if (bVar2) {
          psVar7 = &propTRUE_abi_cxx11_;
        }
      }
      else {
        psVar7 = &propFALSE_abi_cxx11_;
      }
    }
    else {
      psVar7 = &propTRUE_abi_cxx11_;
    }
    return (cmValue)psVar7;
  }
  cVar6 = GetProperty(this,prop);
  return (cmValue)cVar6.Value;
}

Assistant:

cmValue cmSourceFile::GetPropertyForUser(const std::string& prop)
{
  // This method is a consequence of design history and backwards
  // compatibility.  GetProperty is (and should be) a const method.
  // Computed properties should not be stored back in the property map
  // but instead reference information already known.  If they need to
  // cache information in a mutable ivar to provide the return string
  // safely then so be it.
  //
  // The LOCATION property is particularly problematic.  The CMake
  // language has very loose restrictions on the names that will match
  // a given source file (for historical reasons).  Implementing
  // lookups correctly with such loose naming requires the
  // cmSourceFileLocation class to commit to a particular full path to
  // the source file as late as possible.  If the users requests the
  // LOCATION property we must commit now.
  if (prop == propLOCATION) {
    // Commit to a location.
    this->ResolveFullPath();
  }

  // Similarly, LANGUAGE can be determined by the file extension
  // if it is requested by the user.
  if (prop == propLANGUAGE) {
    // The pointer is valid until `this->Language` is modified.
    return cmValue(this->GetOrDetermineLanguage());
  }

  // Special handling for GENERATED property.
  if (prop == propGENERATED) {
    // We need to check policy CMP0163 and CMP0118 in order to determine if we
    // need to possibly consider the value of a locally set GENERATED property,
    // too.
    auto cmp0163 =
      this->Location.GetMakefile()->GetPolicyStatus(cmPolicies::CMP0163);
    auto cmp0118 =
      this->Location.GetMakefile()->GetPolicyStatus(cmPolicies::CMP0118);
    bool const cmp0163new =
      cmp0163 != cmPolicies::OLD && cmp0163 != cmPolicies::WARN;
    bool const cmp0118new = cmp0163new ||
      (cmp0118 != cmPolicies::OLD && cmp0118 != cmPolicies::WARN);
    if (this->GetIsGenerated((!cmp0118new) ? CheckScope::GlobalAndLocal
                                           : CheckScope::Global)) {
      return cmValue(propTRUE);
    }
    return cmValue(propFALSE);
  }

  // Perform the normal property lookup.
  return this->GetProperty(prop);
}